

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_metric_form
          (REF_NODE ref_node,REF_INT node,REF_DBL m11,REF_DBL m12,REF_DBL m13,REF_DBL m22,
          REF_DBL m23,REF_DBL m33)

{
  REF_DBL RStack_88;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL m33_local;
  REF_DBL m23_local;
  REF_DBL m22_local;
  REF_DBL m13_local;
  REF_DBL m12_local;
  REF_DBL m11_local;
  REF_INT node_local;
  REF_NODE ref_node_local;
  
  RStack_88 = m11;
  m[0] = m12;
  m[1] = m13;
  m[2] = m22;
  m[3] = m23;
  m[4] = m33;
  ref_node_local._4_4_ = ref_node_metric_set(ref_node,node,&stack0xffffffffffffff78);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x515,
           "ref_node_metric_form",(ulong)ref_node_local._4_4_,"set");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_metric_form(REF_NODE ref_node, REF_INT node,
                                        REF_DBL m11, REF_DBL m12, REF_DBL m13,
                                        REF_DBL m22, REF_DBL m23, REF_DBL m33) {
  REF_DBL m[6];
  m[0] = m11;
  m[1] = m12;
  m[2] = m13;
  m[3] = m22;
  m[4] = m23;
  m[5] = m33;
  RSS(ref_node_metric_set(ref_node, node, m), "set");
  return REF_SUCCESS;
}